

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

uint prvTidyHTMLVersionNumberFromCode(uint vers)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 4;
  do {
    lVar2 = lVar1;
    if ((int)(lVar2 + 0x28) == 0x324) {
      return 0;
    }
    lVar1 = lVar2 + 0x28;
  } while (*(uint *)((long)&W3C_Doctypes[0].score + lVar2) != vers);
  return *(uint *)((long)&W3C_Doctypes[0].vers + lVar2);
}

Assistant:

uint TY_(HTMLVersionNumberFromCode)( uint vers )
{
    uint i;

    for (i = 0; W3C_Doctypes[i].name; ++i)
        if (W3C_Doctypes[i].vers == vers)
            return W3C_Doctypes[i].vers_out;

    return VERS_UNKNOWN;
}